

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O3

void intemple(int roomno)

{
  boolean bVar1;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  monst *pmVar6;
  obj *poVar7;
  char cVar8;
  char *pcVar9;
  char *__s;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  char buf [256];
  char local_138 [264];
  
  pmVar6 = findpriest((char)roomno);
  if (u.urooms0[0] != '\0') {
    pcVar9 = u.urooms0;
    cVar8 = u.urooms0[0];
    do {
      pcVar9 = pcVar9 + 1;
      if (*(char *)((long)level->monsters + (long)cVar8 * 0xd8 + 0x335c) == '\n') {
        return;
      }
      cVar8 = *pcVar9;
    } while (cVar8 != '\0');
  }
  if (pmVar6 != (monst *)0x0) {
    bVar1 = has_shrine(pmVar6);
    bVar2 = on_level(&u.uz,&dungeon_topology.d_sanctum_level);
    bVar10 = bVar2 == '\0';
    bVar11 = u.uz.dnum != dungeon_topology.d_astral_level.dnum;
    uVar4 = *(uint *)&pmVar6->field_0x60;
    bVar12 = (uVar4 & 0xc0000) == 0x40000;
    bVar13 = flags.soundok != '\0';
    if (!bVar13 || !bVar12) goto LAB_0022a237;
    if (!bVar11 || !bVar10) {
      uVar3 = uVar4;
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if ((u.umonnum == u.umonster) || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0'))
        goto LAB_00229f05;
        uVar3 = *(uint *)&pmVar6->field_0x60;
      }
      *(uint *)&pmVar6->field_0x60 = uVar3 & 0xefffffff;
    }
LAB_00229f05:
    if (pmVar6->wormno == '\0') {
      if ((viz_array[pmVar6->my][pmVar6->mx] & 2U) != 0) goto LAB_0022a1a4;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0022a108;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0022a0ff;
      }
      else {
LAB_0022a0ff:
        if (ublindf == (obj *)0x0) goto LAB_0022a214;
LAB_0022a108:
        if (ublindf->oartifact != '\x1d') goto LAB_0022a214;
      }
      if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_0022a214;
      pcVar9 = "A nearby voice";
      if (((viz_array[pmVar6->my][pmVar6->mx] & 1U) != 0) && ((pmVar6->data->mflags3 & 0x200) != 0))
      goto LAB_0022a1a4;
    }
    else {
      bVar2 = worm_known(level,pmVar6);
      if (bVar2 != '\0') {
LAB_0022a1a4:
        uVar3 = *(uint *)&pmVar6->field_0x60;
        if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar3 & 0x280) != 0) goto LAB_0022a214;
        }
        else {
          pcVar9 = "A nearby voice";
          if (((uVar3 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_0022a21b;
        }
        if ((u._1052_1_ & 0x20) == 0) {
          pcVar9 = Monnam(pmVar6);
          goto LAB_0022a21b;
        }
      }
LAB_0022a214:
      pcVar9 = "A nearby voice";
    }
LAB_0022a21b:
    pline("%s intones:",pcVar9);
    *(uint *)&pmVar6->field_0x60 = *(uint *)&pmVar6->field_0x60 & 0xefffffff | uVar4 & 0x10000000;
LAB_0022a237:
    if ((bVar11 && bVar10) ||
       (bVar2 = on_level(&u.uz,&dungeon_topology.d_sanctum_level), bVar2 == '\0')) {
      pcVar9 = "sacred";
      if (bVar1 == '\0') {
        pcVar9 = "desecrated";
      }
      __s = local_138;
      sprintf(__s,"Pilgrim, you enter a %s place!",pcVar9);
    }
    else {
      if ((*(uint *)&pmVar6->field_0x60 >> 0x16 & 1) != 0) {
        *(uint *)&pmVar6->field_0x60 = *(uint *)&pmVar6->field_0x60 & 0xffbfffff;
        set_malign(pmVar6);
        if (!bVar13 || !bVar12) {
          return;
        }
        verbalize("Infidel, you have entered Moloch\'s Sanctum!");
        verbalize("Be gone!");
        return;
      }
      __s = "You desecrate this place by your presence!";
    }
    if (bVar13 && bVar12) {
      verbalize(__s);
    }
    if (!bVar11 || !bVar10) {
      return;
    }
    if (bVar1 == '\0') {
      pcVar9 = "";
    }
    else {
      pcVar9 = " strange";
      if ((u.ualign.type == pmVar6->field_0x74) && (-4 < u.ualign.record)) {
        pline("You experience a strange sense of peace."," strange");
        return;
      }
    }
    pline("You have a%s forbidding feeling...",pcVar9);
    return;
  }
  uVar4 = mt_random();
  if (uVar4 % 3 == 1) {
    pcVar9 = "You feel like you are being watched.";
LAB_00229f67:
    pline(pcVar9);
  }
  else {
    if (uVar4 % 3 == 0) {
      pcVar9 = "You have an eerie feeling...";
      goto LAB_00229f67;
    }
    pcVar9 = body_part(0xc);
    pline("A shiver runs down your %s.",pcVar9);
  }
  uVar4 = mt_random();
  if (0x33333333 < uVar4 * -0x33333333) {
    return;
  }
  pmVar6 = makemon(mons + 0x12a,level,(int)u.ux,(int)u.uy,0);
  if (pmVar6 == (monst *)0x0) {
    return;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00229ff2;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00229fed;
  }
  else {
LAB_00229fed:
    if (ublindf != (obj *)0x0) {
LAB_00229ff2:
      if (ublindf->oartifact == '\x1d') goto LAB_0022a3c5;
    }
    if (((pmVar6->data->mflags1 & 0x10000) == 0) &&
       ((poVar7 = which_armor(pmVar6,4), poVar7 == (obj *)0x0 ||
        (poVar7 = which_armor(pmVar6,4), poVar7->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0022a04a;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0022a045;
      }
      else {
LAB_0022a045:
        if (ublindf != (obj *)0x0) {
LAB_0022a04a:
          if (ublindf->oartifact == '\x1d') goto LAB_0022a36e;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0022a3c5;
      }
LAB_0022a36e:
      if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_0022a3b1;
      iVar5 = dist2((int)pmVar6->mx,(int)pmVar6->my,(int)u.ux,(int)u.uy);
      pcVar9 = "An enormous ghost appears next to you!";
      if ((iVar5 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_0022a3cc;
    }
    else {
LAB_0022a3b1:
      if (u.uprops[0x42].intrinsic != 0) goto LAB_0022a3c5;
    }
    if (u.uprops[0x42].extrinsic == 0) {
      bVar1 = match_warn_of_mon(pmVar6);
      pcVar9 = "An enormous ghost appears next to you!";
      if (bVar1 == '\0') {
        pcVar9 = "You sense a presence close by!";
      }
      goto LAB_0022a3cc;
    }
  }
LAB_0022a3c5:
  pcVar9 = "An enormous ghost appears next to you!";
LAB_0022a3cc:
  pline(pcVar9);
  pmVar6->field_0x62 = pmVar6->field_0x62 & 0xbf;
  set_malign(pmVar6);
  if (flags.verbose != '\0') {
    pline("You are frightened to death, and unable to move.");
  }
  nomul(-3,"frightened to death");
  nomovemsg = "You regain your composure.";
  return;
}

Assistant:

void intemple(int roomno)
{
	struct monst *priest = findpriest((char)roomno);
	boolean tended = (priest != NULL);
	boolean shrined, sanctum, can_speak;
	const char *msg1, *msg2;
	char buf[BUFSZ];

	if (!temple_occupied(u.urooms0)) {
	    if (tended) {
		shrined = has_shrine(priest);
		sanctum = (Is_sanctum(&u.uz) || In_endgame(&u.uz));
		can_speak = (priest->mcanmove && !priest->msleeping &&
			     flags.soundok);
		if (can_speak) {
		    unsigned save_priest = priest->ispriest;
		    /* don't reveal the altar's owner upon temple entry in
		       the endgame; for the Sanctum, the next message names
		       Moloch so suppress the "of Moloch" for him here too */
		    if (sanctum && !Hallucination) priest->ispriest = 0;
		    pline("%s intones:",
			canseemon(level, priest) ? Monnam(priest) : "A nearby voice");
		    priest->ispriest = save_priest;
		}
		msg2 = 0;
		if (sanctum && Is_sanctum(&u.uz)) {
		    if (priest->mpeaceful) {
			msg1 = "Infidel, you have entered Moloch's Sanctum!";
			msg2 = "Be gone!";
			priest->mpeaceful = 0;
			set_malign(priest);
		    } else
			msg1 = "You desecrate this place by your presence!";
		} else {
		    sprintf(buf, "Pilgrim, you enter a %s place!",
			    !shrined ? "desecrated" : "sacred");
		    msg1 = buf;
		}
		if (can_speak) {
		    verbalize(msg1);
		    if (msg2) verbalize(msg2);
		}
		if (!sanctum) {
		    /* !tended -> !shrined */
		    if (!shrined || !p_coaligned(priest) ||
			    u.ualign.record <= ALGN_SINNED)
			pline("You have a%s forbidding feeling...",
				(!shrined) ? "" : " strange");
		    else pline("You experience a strange sense of peace.");
		}
	    } else {
		switch(rn2(3)) {
		  case 0: pline("You have an eerie feeling..."); break;
		  case 1: pline("You feel like you are being watched."); break;
		  default: pline("A shiver runs down your %s.",
			body_part(SPINE)); break;
		}
		if (!rn2(5)) {
		    struct monst *mtmp;

		    if (!(mtmp = makemon(&mons[PM_GHOST], level, u.ux, u.uy, 
			                 NO_MM_FLAGS)))
			return;
		    if (!Blind || sensemon(mtmp))
			pline("An enormous ghost appears next to you!");
		    else pline("You sense a presence close by!");
		    mtmp->mpeaceful = 0;
		    set_malign(mtmp);
		    if (flags.verbose)
			pline("You are frightened to death, and unable to move.");
		    nomul(-3, "frightened to death");
		    nomovemsg = "You regain your composure.";
	       }
	   }
       }
}